

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O1

void __thiscall
cmScriptGenerator::Generate
          (cmScriptGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurationTypes)

{
  std::__cxx11::string::_M_assign((string *)&this->ConfigurationName);
  this->ConfigurationTypes = configurationTypes;
  (*this->_vptr_cmScriptGenerator[2])(this,os);
  (this->ConfigurationName)._M_string_length = 0;
  *(this->ConfigurationName)._M_dataplus._M_p = '\0';
  this->ConfigurationTypes =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  return;
}

Assistant:

void cmScriptGenerator::Generate(
  std::ostream& os, const std::string& config,
  std::vector<std::string> const& configurationTypes)
{
  this->ConfigurationName = config;
  this->ConfigurationTypes = &configurationTypes;
  this->GenerateScript(os);
  this->ConfigurationName.clear();
  this->ConfigurationTypes = nullptr;
}